

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# space.cpp
# Opt level: O2

int long_range_ship_top_proc(Am_Object *self)

{
  char cVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  Am_Value *pAVar5;
  Am_Object ship;
  Am_Object local_28;
  float local_1c;
  
  Am_Object::Get(0xe3e8,0x67);
  pAVar5 = (Am_Value *)Am_Object::Get((ushort)self,0xa3);
  Am_Object::Am_Object(&ship,pAVar5);
  pAVar5 = (Am_Value *)Am_Object::Get((ushort)&ship,0x68);
  Am_Object::Am_Object(&local_28,pAVar5);
  cVar1 = Am_Object::Valid();
  Am_Object::~Am_Object(&local_28);
  iVar2 = 0;
  if (cVar1 != '\0') {
    pAVar5 = (Am_Value *)Am_Object::Get((ushort)&ship,0x65);
    iVar2 = Am_Value::operator_cast_to_int(pAVar5);
    pAVar5 = (Am_Value *)Am_Object::Get((ushort)&ship,0x67);
    iVar3 = Am_Value::operator_cast_to_int(pAVar5);
    local_1c = get_long_short_ratio_y();
    pAVar5 = (Am_Value *)Am_Object::Get((ushort)self,0x67);
    iVar4 = Am_Value::operator_cast_to_int(pAVar5);
    iVar2 = iVar4 / -2 + (int)(local_1c * (float)(iVar3 / 2 + iVar2));
  }
  Am_Object::~Am_Object(&ship);
  return iVar2;
}

Assistant:

Am_Define_Formula(int, long_range_ship_top)
{
  // Set up dependency on long-range win height so that long-range ships
  // will reposition if the window is resized.
  /*int long_win_height =*/SP_Long_Win.Get(Am_HEIGHT);
  Am_Object ship = (Am_Object)(self.Get(Am_ITEM));
  if (((Am_Object)ship.Get(Am_WINDOW)).Valid()) {
    int ship_center_y =
        ((int)(ship.Get(Am_TOP)) + ((int)(ship.Get(Am_HEIGHT)) / 2));
    float ratio_y = get_long_short_ratio_y();
    int long_center_y = (int)(ship_center_y * ratio_y);
    int long_height = self.Get(Am_HEIGHT);
    return (long_center_y - (long_height / 2));
  } else
    // Ship has no window, so might be item_prototype
    return 0;
}